

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int libssh2_channel_request_pty_ex
              (LIBSSH2_CHANNEL *channel,char *term,uint term_len,char *modes,uint modes_len,
              int width,int height,int width_px,int height_px)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  int width_local;
  uint modes_len_local;
  char *modes_local;
  uint term_len_local;
  char *term_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._4_4_ =
           channel_request_pty(channel,term,term_len,modes,modes_len,width,height,width_px,height_px
                              );
      if ((entry_time._4_4_ != -0x25) || (channel->session->api_block_mode == 0)) break;
      entry_time._4_4_ = _libssh2_wait_socket(channel->session,start_time);
    } while (entry_time._4_4_ == 0);
    channel_local._4_4_ = entry_time._4_4_;
  }
  return channel_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_channel_request_pty_ex(LIBSSH2_CHANNEL *channel, const char *term,
                               unsigned int term_len, const char *modes,
                               unsigned int modes_len, int width, int height,
                               int width_px, int height_px)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_request_pty(channel, term, term_len, modes,
                                     modes_len, width, height,
                                     width_px, height_px));
    return rc;
}